

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::UnitTestOptions::GetOutputFormat_abi_cxx11_(void)

{
  char *__s;
  char *pcVar1;
  string *in_RDI;
  char *colon;
  char *gtest_output_flag;
  string s;
  undefined2 in_stack_ffffffffffffffb0;
  byte bVar2;
  undefined5 in_stack_ffffffffffffffb3;
  char *in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffc0;
  byte bVar3;
  allocator<char> in_stack_ffffffffffffffc7;
  string local_28 [40];
  
  std::__cxx11::string::string(local_28,(string *)FLAGS_gtest_output_abi_cxx11_);
  __s = (char *)std::__cxx11::string::c_str();
  pcVar1 = strchr(__s,0x3a);
  bVar3 = 0;
  bVar2 = 0;
  if (pcVar1 == (char *)0x0) {
    std::allocator<char>::allocator();
    bVar3 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffffc7,CONCAT16(1,in_stack_ffffffffffffffc0)),
               in_stack_ffffffffffffffb8,
               (allocator<char> *)
               CONCAT53(in_stack_ffffffffffffffb3,CONCAT12(bVar2,in_stack_ffffffffffffffb0)));
  }
  else {
    std::allocator<char>::allocator();
    bVar2 = 1;
    std::__cxx11::string::string
              ((string *)in_RDI,__s,(long)pcVar1 - (long)__s,(allocator *)&stack0xffffffffffffffb3);
  }
  if ((bVar2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb3);
  }
  if ((bVar3 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  }
  std::__cxx11::string::~string(local_28);
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetOutputFormat() {
  std::string s = GTEST_FLAG_GET(output);
  const char* const gtest_output_flag = s.c_str();
  const char* const colon = strchr(gtest_output_flag, ':');
  return (colon == nullptr)
             ? std::string(gtest_output_flag)
             : std::string(gtest_output_flag,
                           static_cast<size_t>(colon - gtest_output_flag));
}